

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1f34c17::Impl::registerHandler
          (Impl *this,TypeInfo *typeinfo,GenericResponseSentHandler *handler)

{
  GenericResponseSentHandler *handler_local;
  TypeInfo *typeinfo_local;
  Impl *this_local;
  
  EventHandlers::put(&this->handlers,typeinfo,handler);
  return;
}

Assistant:

void registerHandler(const dap::TypeInfo* typeinfo,
                       const GenericResponseSentHandler& handler) override {
    handlers.put(typeinfo, handler);
  }